

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O0

void __thiscall Assimp::Q3BSPFileParser::getFaces(Q3BSPFileParser *this)

{
  reference ppsVar1;
  sQ3BSPFace *psVar2;
  value_type __dest;
  reference __src;
  reference ppsVar3;
  sQ3BSPFace *pFace;
  size_t idx;
  size_t Offset;
  Q3BSPFileParser *this_local;
  
  if (this->m_pModel != (Q3BSPModel *)0x0) {
    ppsVar1 = std::vector<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
              ::operator[](&this->m_pModel->m_Lumps,0xd);
    idx = (size_t)(*ppsVar1)->iOffset;
    pFace = (sQ3BSPFace *)0x0;
    while( true ) {
      psVar2 = (sQ3BSPFace *)
               std::
               vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>::
               size(&this->m_pModel->m_Faces);
      if (psVar2 <= pFace) break;
      __dest = (value_type)operator_new(0x68);
      __src = std::vector<char,_std::allocator<char>_>::operator[](&this->m_Data,idx);
      memcpy(__dest,__src,0x68);
      ppsVar3 = std::
                vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>::
                operator[](&this->m_pModel->m_Faces,(size_type)pFace);
      *ppsVar3 = __dest;
      idx = idx + 0x68;
      pFace = (sQ3BSPFace *)((long)&pFace->iTextureID + 1);
    }
    return;
  }
  __assert_fail("nullptr != m_pModel",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Q3BSP/Q3BSPFileParser.cpp"
                ,0xda,"void Assimp::Q3BSPFileParser::getFaces()");
}

Assistant:

void Q3BSPFileParser::getFaces()
{
    ai_assert(nullptr != m_pModel );

    size_t Offset = m_pModel->m_Lumps[ kFaces ]->iOffset;
    for ( size_t idx = 0; idx < m_pModel->m_Faces.size(); idx++ )
    {
        sQ3BSPFace *pFace = new sQ3BSPFace;
        memcpy( pFace, &m_Data[ Offset ], sizeof( sQ3BSPFace ) );
        m_pModel->m_Faces[ idx ] = pFace;
        Offset += sizeof( sQ3BSPFace );
    }
}